

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# background_thread.c
# Opt level: O0

_Bool background_threads_disable(tsd_t *tsd)

{
  _Bool _Var1;
  tsd_t *in_RDI;
  undefined7 in_stack_fffffffffffffff0;
  undefined1 in_stack_fffffffffffffff7;
  
  malloc_mutex_assert_owner((tsdn_t *)in_RDI,(malloc_mutex_t *)0x1253f4);
  _Var1 = background_threads_disable_single
                    (in_RDI,(background_thread_info_t *)
                            CONCAT17(in_stack_fffffffffffffff7,in_stack_fffffffffffffff0));
  return _Var1;
}

Assistant:

bool
background_threads_disable(tsd_t *tsd) {
	assert(!background_thread_enabled());
	malloc_mutex_assert_owner(tsd_tsdn(tsd), &background_thread_lock);

	/* Thread 0 will be responsible for terminating other threads. */
	if (background_threads_disable_single(tsd,
	    &background_thread_info[0])) {
		return true;
	}
	assert(n_background_threads == 0);

	return false;
}